

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2CapturedGroupTest(void)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *pmVar4;
  pointer ppVar5;
  string *local_fe8;
  string *local_ef8;
  LogMessage local_ed8;
  LogMessage local_d58;
  LogMessage local_bd8;
  LogMessage local_a58;
  allocator local_8d1;
  string local_8d0 [32];
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_8b0;
  int local_8a8;
  allocator local_8a1;
  int destination_group_index;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_880;
  int local_874;
  undefined1 local_870 [4];
  int source_group_index;
  _Self local_6f0;
  allocator local_6e1;
  string local_6e0 [32];
  _Self local_6c0;
  LogMessage local_6b8;
  _Self local_538;
  allocator local_529;
  string local_528 [32];
  _Self local_508;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_500;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *named_groups;
  StringPiece local_378;
  Arg *local_368;
  Arg *matches [4];
  Arg arg3;
  Arg arg2;
  Arg arg1;
  Arg arg0;
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string asStack_288 [8];
  LogMessage local_280;
  int local_ec;
  undefined1 local_e8 [4];
  int num_groups;
  RE2 re;
  
  RE2::RE2((RE2 *)local_e8,"directions from (?P<S>.*) to (?P<D>.*)");
  local_ec = RE2::NumberOfCapturingGroups((RE2 *)local_e8);
  if (local_ec != 2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x227);
    poVar3 = LogMessage::stream(&local_280);
    std::operator<<(poVar3,"Check failed: (2) == (num_groups)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_280);
  }
  local_ef8 = (string *)&arg0.parser_;
  do {
    std::__cxx11::string::string(local_ef8);
    local_ef8 = local_ef8 + 0x20;
  } while (local_ef8 != asStack_288);
  RE2::Arg::Arg((Arg *)&arg1.parser_,(string *)&arg0.parser_);
  RE2::Arg::Arg((Arg *)&arg2.parser_,local_2e8);
  RE2::Arg::Arg((Arg *)&arg3.parser_,local_2c8);
  RE2::Arg::Arg((Arg *)(matches + 3),local_2a8);
  local_368 = (Arg *)&arg1.parser_;
  matches[0] = (Arg *)&arg2.parser_;
  matches[1] = (Arg *)&arg3.parser_;
  matches[2] = (Arg *)(matches + 3);
  StringPiece::StringPiece(&local_378,"directions from mountain view to san jose");
  bVar2 = RE2::FullMatchN(&local_378,(RE2 *)local_e8,&local_368,local_ec);
  if (!bVar2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&named_groups,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x230);
    poVar3 = LogMessage::stream((LogMessage *)&named_groups);
    std::operator<<(poVar3,
                    "Check failed: RE2::FullMatchN(\"directions from mountain view to san jose\", re, matches, num_groups)"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&named_groups);
  }
  pmVar4 = RE2::NamedCapturingGroups_abi_cxx11_((RE2 *)local_e8);
  local_500 = pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_528,"S",&local_529);
  local_508._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(pmVar4,(key_type *)local_528);
  local_538._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(local_500);
  bVar2 = std::operator!=(&local_508,&local_538);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  if (!bVar2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_6b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x232);
    poVar3 = LogMessage::stream(&local_6b8);
    std::operator<<(poVar3,"Check failed: named_groups.find(\"S\") != named_groups.end()");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_6b8);
  }
  pmVar4 = local_500;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6e0,"D",&local_6e1);
  local_6c0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(pmVar4,(key_type *)local_6e0);
  local_6f0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(local_500);
  bVar2 = std::operator!=(&local_6c0,&local_6f0);
  std::__cxx11::string::~string(local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
  if (!bVar2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_870,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x233);
    poVar3 = LogMessage::stream((LogMessage *)local_870);
    std::operator<<(poVar3,"Check failed: named_groups.find(\"D\") != named_groups.end()");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_870);
  }
  pmVar4 = local_500;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&destination_group_index,"S",&local_8a1);
  local_880._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(pmVar4,(key_type *)&destination_group_index);
  ppVar5 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
           ::operator->(&local_880);
  iVar1 = ppVar5->second;
  std::__cxx11::string::~string((string *)&destination_group_index);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a1);
  pmVar4 = local_500;
  local_874 = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8d0,"D",&local_8d1);
  local_8b0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(pmVar4,(key_type *)local_8d0);
  ppVar5 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
           ::operator->(&local_8b0);
  iVar1 = ppVar5->second;
  std::__cxx11::string::~string(local_8d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
  local_8a8 = iVar1;
  if (local_874 != 1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a58,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x238);
    poVar3 = LogMessage::stream(&local_a58);
    std::operator<<(poVar3,"Check failed: (1) == (source_group_index)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_a58);
  }
  if (local_8a8 != 2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_bd8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x239);
    poVar3 = LogMessage::stream(&local_bd8);
    std::operator<<(poVar3,"Check failed: (2) == (destination_group_index)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_bd8);
  }
  bVar2 = std::operator==("mountain view",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &(&arg0)[(long)(local_874 + -1) * 2].parser_);
  if (!bVar2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_d58,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x23c);
    poVar3 = LogMessage::stream(&local_d58);
    std::operator<<(poVar3,"Check failed: (\"mountain view\") == (args[source_group_index - 1])");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_d58);
  }
  bVar2 = std::operator==("san jose",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &(&arg0)[(long)(local_8a8 + -1) * 2].parser_);
  if (!bVar2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_ed8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x23d);
    poVar3 = LogMessage::stream(&local_ed8);
    std::operator<<(poVar3,"Check failed: (\"san jose\") == (args[destination_group_index - 1])");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_ed8);
  }
  local_fe8 = asStack_288;
  do {
    local_fe8 = local_fe8 + -0x20;
    std::__cxx11::string::~string(local_fe8);
  } while (local_fe8 != (string *)&arg0.parser_);
  RE2::~RE2((RE2 *)local_e8);
  return;
}

Assistant:

TEST(RE2, CapturedGroupTest) {
  RE2 re("directions from (?P<S>.*) to (?P<D>.*)");
  int num_groups = re.NumberOfCapturingGroups();
  EXPECT_EQ(2, num_groups);
  string args[4];
  RE2::Arg arg0(&args[0]);
  RE2::Arg arg1(&args[1]);
  RE2::Arg arg2(&args[2]);
  RE2::Arg arg3(&args[3]);

  const RE2::Arg* const matches[4] = {&arg0, &arg1, &arg2, &arg3};
  EXPECT_TRUE(RE2::FullMatchN("directions from mountain view to san jose",
                              re, matches, num_groups));
  const map<string, int>& named_groups = re.NamedCapturingGroups();
  EXPECT_TRUE(named_groups.find("S") != named_groups.end());
  EXPECT_TRUE(named_groups.find("D") != named_groups.end());

  // The named group index is 1-based.
  int source_group_index = named_groups.find("S")->second;
  int destination_group_index = named_groups.find("D")->second;
  EXPECT_EQ(1, source_group_index);
  EXPECT_EQ(2, destination_group_index);

  // The args is zero-based.
  EXPECT_EQ("mountain view", args[source_group_index - 1]);
  EXPECT_EQ("san jose", args[destination_group_index - 1]);
}